

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O2

String * __thiscall
Jinx::Impl::FunctionSignature::GetName_abi_cxx11_
          (String *__return_storage_ptr__,FunctionSignature *this)

{
  pointer pbVar1;
  char *pcVar2;
  pointer pFVar3;
  pointer __str;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,0x20);
  if ((this->m_libraryName)._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__,&this->m_libraryName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__," ");
  }
  pFVar3 = (this->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pFVar3 == (this->m_parts).
                  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    if (pFVar3->partType == Name) {
      if (pFVar3->optional == true) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,"(");
      }
      __str = (pFVar3->names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start;
      while (__str != (pFVar3->names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,__str);
        __str = __str + 1;
        pbVar1 = (pFVar3->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((__str != pbVar1) &&
           (0x20 < (ulong)((long)pbVar1 -
                          (long)(pFVar3->names).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                                ._M_impl.super__Vector_impl_data._M_start))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (__return_storage_ptr__,"/");
        }
      }
      pcVar2 = ")";
      if (pFVar3->optional != false) goto LAB_00116061;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (__return_storage_ptr__,"{");
      pcVar2 = "}";
      if (pFVar3->valueType != Any) {
        pcVar2 = GetValueTypeName(pFVar3->valueType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__,pcVar2);
        pcVar2 = "}";
      }
LAB_00116061:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (__return_storage_ptr__,pcVar2);
    }
    pFVar3 = pFVar3 + 1;
    if (pFVar3 != (this->m_parts).
                  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (__return_storage_ptr__," ");
    }
  } while( true );
}

Assistant:

inline_t String FunctionSignature::GetName() const
	{
		String fnName;
		fnName.reserve(32);
		if (!m_libraryName.empty())
		{
			fnName += m_libraryName;
			fnName += " ";
		}
		for (auto partItr = m_parts.begin(); partItr != m_parts.end();)
		{
			if (partItr->partType == FunctionSignaturePartType::Name)
			{
				if (partItr->optional)
					fnName += "(";
				for (auto nameItr = partItr->names.begin(); nameItr != partItr->names.end();)
				{
					fnName += *nameItr;
					++nameItr;
					if (nameItr != partItr->names.end() && partItr->names.size() > 1)
						fnName += "/";
				}
				if (partItr->optional)
					fnName += ")";
			}
			else
			{
				fnName += "{";
				if (partItr->valueType != ValueType::Any)
					fnName += GetValueTypeName(partItr->valueType);
				fnName += "}";
			}

			++partItr;
			if (partItr != m_parts.end())
				fnName += " ";
		}
		return fnName;
	}